

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

TValue * luaH_getstr(Table *t,TString *key)

{
  Node *local_28;
  Node *n;
  TString *key_local;
  Table *t_local;
  
  local_28 = t->node + (int)((key->tsv).hash & (1 << (t->lsizenode & 0x1f)) - 1U);
  while (((local_28->i_key).nk.tt != 4 || ((local_28->i_key).nk.value.gc != (GCObject *)key))) {
    local_28 = (local_28->i_key).nk.next;
    if (local_28 == (Node *)0x0) {
      return &luaO_nilobject_;
    }
  }
  return &local_28->i_val;
}

Assistant:

const TValue *luaH_getstr (Table *t, TString *key) {
  Node *n = hashstr(t, key);
  do {  /* check whether `key' is somewhere in the chain */
    if (ttisstring(gkey(n)) && rawtsvalue(gkey(n)) == key)
      return gval(n);  /* that's it */
    else n = gnext(n);
  } while (n);
  return luaO_nilobject;
}